

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

void __thiscall
tcu::TestLog::writeImage
          (TestLog *this,char *name,char *description,ConstPixelBufferAccess *access,
          Vec4 *pixelScale,Vec4 *pixelBias,qpImageCompressionMode compressionMode)

{
  IVec3 *pIVar1;
  bool bVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  int iVar5;
  int i;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  float fVar11;
  int y_1;
  int iVar12;
  int iVar13;
  int x;
  int iVar14;
  int y;
  int iVar15;
  int iVar16;
  int x_1;
  int iVar17;
  uint uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int local_370;
  int local_36c;
  int local_33c;
  int local_338;
  int local_334;
  int local_32c;
  Vec4 s;
  IVec3 scaledSize;
  Vec4 p;
  PixelBufferAccess logImageAccess;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined8 local_26c;
  undefined1 uStack_264;
  undefined7 uStack_263;
  undefined1 uStack_25c;
  undefined8 uStack_25b;
  undefined4 local_250;
  ulong local_248;
  ulong local_240;
  char *local_238;
  TextureLevel logImage;
  PixelBufferAccess blendImageAccess;
  vector<float,_std::allocator<float>_> blendImage;
  Vec4 b;
  ostringstream longDesc;
  tcu local_40 [16];
  
  pIVar1 = &access->m_size;
  iVar13 = pIVar1->m_data[0];
  iVar17 = (access->m_size).m_data[1];
  pp_Var4 = *(_func_int ***)pIVar1->m_data;
  pp_Var3 = *(_func_int ***)pIVar1->m_data;
  iVar8 = (access->m_size).m_data[2];
  dVar6 = qpTestLog_getLogFlags(this->m_log);
  if ((dVar6 & 1) == 0) {
    if (iVar8 == 1) {
      if (((iVar17 < 0x1001) && (iVar13 < 0x1001)) &&
         (((access->m_format).type == UNORM_INT8 &&
          (((access->m_format).order - RGB < 2 &&
           (iVar8 = (access->m_pitch).m_data[0],
           iVar7 = TextureFormat::getPixelSize(&access->m_format), iVar8 == iVar7)))))) {
        auVar20._4_4_ = -(uint)(pixelBias->m_data[1] != 0.0);
        auVar20._0_4_ = -(uint)(pixelBias->m_data[0] != 0.0);
        auVar20._8_4_ = -(uint)(pixelBias->m_data[2] != 0.0);
        auVar20._12_4_ = -(uint)(pixelBias->m_data[3] != 0.0);
        auVar21._4_4_ = -(uint)(pixelScale->m_data[1] != 1.0);
        auVar21._0_4_ = -(uint)(pixelScale->m_data[0] != 1.0);
        auVar21._8_4_ = -(uint)(pixelScale->m_data[2] != 1.0);
        auVar21._12_4_ = -(uint)(pixelScale->m_data[3] != 1.0);
        auVar21 = packssdw(auVar20,auVar21);
        auVar21 = packsswb(auVar21,auVar21);
        if ((((((((auVar21 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar21 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar21 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar21 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          writeImage(this,name,description,compressionMode,(uint)((access->m_format).order == RGBA),
                     iVar13,iVar17,(access->m_pitch).m_data[1],access->m_data);
          return;
        }
      }
      local_288 = 0;
      uStack_280 = 0x100000000;
      local_278 = 0;
      local_270 = 1;
      local_250 = 0;
      local_26c = 0;
      uStack_264 = 0;
      uStack_263 = 0;
      uStack_25c = 0;
      uStack_25b = 0;
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = pp_Var4;
      bVar2 = true;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        if (bVar2) {
          bVar2 = *(int *)(local_40 + lVar9 * 4 + -0x178) < 0x1001;
        }
        else {
          bVar2 = false;
        }
      }
      if (bVar2) {
        Vector<int,_2>::Vector((Vector<int,_2> *)&s,(Vector<int,_2> *)&longDesc);
      }
      else {
        fVar19 = 1.0;
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          uVar18 = -(uint)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) * 0.00024414062 <= fVar19)
          ;
          fVar19 = (float)((uint)fVar19 & uVar18 |
                          ~uVar18 & (uint)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) *
                                          0.00024414062));
        }
        s.m_data[0] = 0.0;
        s.m_data[1] = 0.0;
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          fVar11 = (float)(int)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) / fVar19 +
                               *(float *)(&DAT_017c9790 +
                                         (ulong)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) /
                                                 fVar19 < 0.0) * 4));
          if ((int)fVar11 < 2) {
            fVar11 = 1.4013e-45;
          }
          s.m_data[lVar9] = fVar11;
        }
      }
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x300000008;
      TextureLevel::TextureLevel
                ((TextureLevel *)&blendImageAccess,(TextureFormat *)&longDesc,(int)s.m_data[0],
                 (int)s.m_data[1],1);
      TextureLevel::getAccess((PixelBufferAccess *)&logImage,(TextureLevel *)&blendImageAccess);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&longDesc);
      poVar10 = std::operator<<(&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,
                                description);
      poVar10 = std::operator<<(poVar10," (p\' = p * ");
      poVar10 = tcu::operator<<(poVar10,pixelScale);
      poVar10 = std::operator<<(poVar10," + ");
      poVar10 = tcu::operator<<(poVar10,pixelBias);
      std::operator<<(poVar10,")");
      for (iVar13 = 0; iVar13 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1];
          iVar13 = iVar13 + 1) {
        for (iVar17 = 0; iVar17 < blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0];
            iVar17 = iVar17 + 1) {
          ConstPixelBufferAccess::sample2D
                    ((ConstPixelBufferAccess *)&blendImage,(Sampler *)access,(FilterMode)&local_288,
                     ((float)iVar17 + 0.5) /
                     (float)blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0],
                     ((float)iVar13 + 0.5) /
                     (float)blendImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1],
                     uStack_280._4_4_);
          tcu::operator*((tcu *)&p,(Vector<float,_4> *)&blendImage,pixelScale);
          tcu::operator+((tcu *)&logImageAccess,(Vector<float,_4> *)&p,pixelBias);
          PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&logImage,(Vec4 *)&logImageAccess,iVar17,iVar13,0);
        }
      }
      std::__cxx11::stringbuf::str();
      writeImage(this,name,(char *)logImageAccess.super_ConstPixelBufferAccess.m_format,
                 compressionMode,QP_IMAGE_FORMAT_RGBA8888,logImage.m_size.m_data[0],
                 logImage.m_size.m_data[1],(int)logImage.m_data.m_ptr,(void *)logImage.m_data.m_cap)
      ;
      std::__cxx11::string::~string((string *)&logImageAccess);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&longDesc);
      TextureLevel::~TextureLevel((TextureLevel *)&blendImageAccess);
    }
    else {
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = pp_Var3;
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = iVar8;
      bVar2 = true;
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        if (bVar2) {
          bVar2 = *(int *)(local_40 + lVar9 * 4 + -0x178) < 0x81;
        }
        else {
          bVar2 = false;
        }
      }
      if (bVar2) {
        Vector<int,_3>::Vector(&scaledSize,(Vector<int,_3> *)&longDesc);
      }
      else {
        fVar19 = 1.0;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          uVar18 = -(uint)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) * 0.0078125 <= fVar19);
          fVar19 = (float)((uint)fVar19 & uVar18 |
                          ~uVar18 & (uint)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) *
                                          0.0078125));
        }
        Vector<int,_3>::Vector(&scaledSize);
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          iVar13 = (int)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) / fVar19 +
                        *(float *)(&DAT_017c9790 +
                                  (ulong)((float)*(int *)(local_40 + lVar9 * 4 + -0x178) / fVar19 <
                                         0.0) * 4));
          if (iVar13 < 2) {
            iVar13 = 1;
          }
          scaledSize.m_data[lVar9] = iVar13;
        }
      }
      iVar17 = scaledSize.m_data[2] + scaledSize.m_data[0] + -1;
      iVar13 = scaledSize.m_data[2] + scaledSize.m_data[0] + scaledSize.m_data[1];
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           ((ulong)longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
           0xffffffff00000000);
      std::vector<float,_std::allocator<float>_>::vector
                (&blendImage,(long)(iVar13 * iVar17 * 4),(value_type_conflict2 *)&longDesc,
                 (allocator_type *)&local_288);
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x2300000008;
      PixelBufferAccess::PixelBufferAccess
                (&blendImageAccess,(TextureFormat *)&longDesc,iVar17,iVar13,1,
                 blendImage.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      longDesc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x300000008;
      TextureLevel::TextureLevel(&logImage,(TextureFormat *)&longDesc,iVar17,iVar13,1);
      TextureLevel::getAccess(&logImageAccess,&logImage);
      local_288 = 0;
      uStack_280 = 0;
      local_278 = 0;
      local_270 = 1;
      local_250 = 0;
      local_26c = 0;
      uStack_264 = 0;
      uStack_263 = 0;
      uStack_25c = 0;
      uStack_25b = 0;
      local_238 = description;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&longDesc);
      iVar13 = 0;
      if (0 < scaledSize.m_data[0]) {
        iVar13 = scaledSize.m_data[0];
      }
      iVar17 = 0;
      if (0 < scaledSize.m_data[1]) {
        iVar17 = scaledSize.m_data[1];
      }
      local_33c = scaledSize.m_data[1] + scaledSize.m_data[0];
      local_334 = scaledSize.m_data[2] + -2 + scaledSize.m_data[0];
      local_338 = scaledSize.m_data[2];
      local_248 = (ulong)(uint)scaledSize.m_data[2];
      local_240 = (ulong)(uint)scaledSize.m_data[1];
      while (local_338 = local_338 + -1, -1 < local_338) {
        local_32c = local_33c;
        for (iVar8 = 0; iVar8 != iVar17; iVar8 = iVar8 + 1) {
          iVar12 = local_32c;
          iVar7 = local_334;
          for (iVar14 = 0; iVar13 != iVar14; iVar14 = iVar14 + 1) {
            ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&p,(int)&blendImageAccess,iVar7,iVar12);
            ConstPixelBufferAccess::sample3D
                      ((ConstPixelBufferAccess *)&s,(Sampler *)access,(FilterMode)&local_288,
                       ((float)iVar14 + 0.5) / (float)scaledSize.m_data[0],
                       ((float)iVar8 + 0.5) / (float)scaledSize.m_data[1],
                       ((float)local_338 + 0.5) / (float)scaledSize.m_data[2]);
            tcu::operator*(local_40,0.85,&p);
            tcu::operator+((tcu *)&b,(Vector<float,_4> *)&s,(Vector<float,_4> *)local_40);
            PixelBufferAccess::setPixel(&blendImageAccess,&b,iVar7,iVar12,0);
            iVar12 = iVar12 + -1;
            iVar7 = iVar7 + -1;
          }
          local_32c = local_32c + -1;
        }
        local_33c = local_33c + 1;
        local_334 = local_334 + -1;
      }
      poVar10 = std::operator<<(&longDesc.super_basic_ostream<char,_std::char_traits<char>_>,
                                local_238);
      poVar10 = std::operator<<(poVar10," (p\' = p * ");
      poVar10 = tcu::operator<<(poVar10,pixelScale);
      poVar10 = std::operator<<(poVar10," + ");
      poVar10 = tcu::operator<<(poVar10,pixelBias);
      std::operator<<(poVar10,")");
      p.m_data[0] = 7.14662e-44;
      p.m_data[1] = 1.42932e-43;
      p.m_data[2] = 2.14399e-43;
      p.m_data[3] = 3.57331e-43;
      tcu::clear(&logImageAccess,(IVec4 *)&p);
      iVar8 = (int)local_240;
      iVar14 = 0;
      iVar12 = (int)local_248;
      iVar7 = 0;
      if (0 < iVar12) {
        iVar7 = iVar12;
      }
      local_370 = iVar8 + iVar12 + scaledSize.m_data[0];
      iVar12 = scaledSize.m_data[0] + -1;
      for (; local_370 = local_370 + -1, iVar14 != iVar7; iVar14 = iVar14 + 1) {
        local_36c = local_370;
        for (iVar15 = 0; iVar15 != iVar17; iVar15 = iVar15 + 1) {
          iVar5 = 0;
          while (iVar16 = iVar5, -iVar13 != iVar16) {
            iVar5 = iVar16 + -1;
            if ((((iVar15 == iVar8 + -2) || (iVar15 == iVar8 + -1)) || (iVar14 == 0)) ||
               (iVar16 == 0)) {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&b,(int)&blendImageAccess,iVar12 + iVar16,
                         iVar16 + local_36c);
              tcu::operator*((tcu *)&s,&b,pixelScale);
              tcu::operator+((tcu *)&p,&s,pixelBias);
              PixelBufferAccess::setPixel(&logImageAccess,&p,iVar12 + iVar16,iVar16 + local_36c,0);
            }
          }
          local_36c = local_36c + -1;
        }
        iVar12 = iVar12 + 1;
      }
      std::__cxx11::stringbuf::str();
      writeImage(this,name,(char *)p.m_data._0_8_,compressionMode,QP_IMAGE_FORMAT_RGBA8888,
                 logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[0],
                 logImageAccess.super_ConstPixelBufferAccess.m_size.m_data[1],
                 logImageAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1],
                 logImageAccess.super_ConstPixelBufferAccess.m_data);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&longDesc);
      TextureLevel::~TextureLevel(&logImage);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&blendImage.super__Vector_base<float,_std::allocator<float>_>);
    }
  }
  return;
}

Assistant:

void TestLog::writeImage (const char* name, const char* description, const ConstPixelBufferAccess& access, const Vec4& pixelScale, const Vec4& pixelBias, qpImageCompressionMode compressionMode)
{
	const TextureFormat&	format		= access.getFormat();
	int						width		= access.getWidth();
	int						height		= access.getHeight();
	int						depth		= access.getDepth();

	// Writing a combined image does not make sense
	DE_ASSERT(!tcu::isCombinedDepthStencilType(access.getFormat().type));

	// Do not bother with preprocessing if images are not stored
	if ((qpTestLog_getLogFlags(m_log) & QP_TEST_LOG_EXCLUDE_IMAGES) != 0)
		return;

	if (depth == 1 && format.type == TextureFormat::UNORM_INT8
		&& width <= MAX_IMAGE_SIZE_2D && height <= MAX_IMAGE_SIZE_2D
		&& (format.order == TextureFormat::RGB || format.order == TextureFormat::RGBA)
		&& access.getPixelPitch() == access.getFormat().getPixelSize()
		&& pixelBias[0] == 0.0f && pixelBias[1] == 0.0f && pixelBias[2] == 0.0f && pixelBias[3] == 0.0f
		&& pixelScale[0] == 1.0f && pixelScale[1] == 1.0f && pixelScale[2] == 1.0f && pixelScale[3] == 1.0f)
	{
		// Fast-path.
		bool isRGBA = format.order == TextureFormat::RGBA;

		writeImage(name, description, compressionMode,
				   isRGBA ? QP_IMAGE_FORMAT_RGBA8888 : QP_IMAGE_FORMAT_RGB888,
				   width, height, access.getRowPitch(), access.getDataPtr());
	}
	else if (depth == 1)
	{
		Sampler				sampler			(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::LINEAR, Sampler::NEAREST);
		IVec2				logImageSize	= computeScaledSize(IVec2(width, height), MAX_IMAGE_SIZE_2D);
		tcu::TextureLevel	logImage		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageSize.x(), logImageSize.y(), 1);
		PixelBufferAccess	logImageAccess	= logImage.getAccess();
		std::ostringstream	longDesc;

		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		for (int y = 0; y < logImage.getHeight(); y++)
		{
			for (int x = 0; x < logImage.getWidth(); x++)
			{
				float	yf	= ((float)y + 0.5f) / (float)logImage.getHeight();
				float	xf	= ((float)x + 0.5f) / (float)logImage.getWidth();
				Vec4	s	= access.sample2D(sampler, sampler.minFilter, xf, yf, 0)*pixelScale + pixelBias;

				logImageAccess.setPixel(s, x, y);
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
	else
	{
		// Isometric splat volume rendering.
		const float			blendFactor			= 0.85f;
		IVec3				scaledSize			= computeScaledSize(IVec3(width, height, depth), MAX_IMAGE_SIZE_3D);
		int					w					= scaledSize.x();
		int					h					= scaledSize.y();
		int					d					= scaledSize.z();
		int					logImageW			= w+d - 1;
		int					logImageH			= w+d+h;
		std::vector<float>	blendImage			(logImageW*logImageH*4, 0.0f);
		PixelBufferAccess	blendImageAccess	(TextureFormat(TextureFormat::RGBA, TextureFormat::FLOAT), logImageW, logImageH, 1, &blendImage[0]);
		tcu::TextureLevel	logImage			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), logImageW, logImageH, 1);
		PixelBufferAccess	logImageAccess		= logImage.getAccess();
		Sampler				sampler				(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
		std::ostringstream	longDesc;

		// \note Back-to-front.
		for (int z = d-1; z >= 0; z--)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);

					float	xf	= ((float)x + 0.5f) / (float)w;
					float	yf	= ((float)y + 0.5f) / (float)h;
					float	zf	= ((float)z + 0.5f) / (float)d;

					Vec4	p	= blendImageAccess.getPixel(px, py);
					Vec4	s	= access.sample3D(sampler, sampler.minFilter, xf, yf, zf);
					Vec4	b	= s + p*blendFactor;

					blendImageAccess.setPixel(b, px, py);
				}
			}
		}

		// Scale blend image nicely.
		longDesc << description << " (p' = p * " << pixelScale << " + " << pixelBias << ")";

		// Write to final image.
		tcu::clear(logImageAccess, tcu::IVec4(0x33, 0x66, 0x99, 0xff));

		for (int z = 0; z < d; z++)
		{
			for (int y = 0; y < h; y++)
			{
				for (int x = 0; x < w; x++)
				{
					if (z != 0 && !(x == 0 || y == h-1 || y == h-2))
						continue;

					int		px	= w - (x + 1) + z;
					int		py	= (w + d + h) - (x + y + z + 1);
					Vec4	s	= blendImageAccess.getPixel(px, py)*pixelScale + pixelBias;

					logImageAccess.setPixel(s, px, py);
				}
			}
		}

		writeImage(name, longDesc.str().c_str(), compressionMode, QP_IMAGE_FORMAT_RGBA8888,
				   logImageAccess.getWidth(), logImageAccess.getHeight(), logImageAccess.getRowPitch(),
				   logImageAccess.getDataPtr());
	}
}